

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

CURLMcode Curl_multi_ev_assess_xfer_list(Curl_multi *multi,Curl_llist *list)

{
  Curl_easy *data;
  CURLMcode local_24;
  Curl_llist_node *pCStack_20;
  CURLMcode result;
  Curl_llist_node *e;
  Curl_llist *list_local;
  Curl_multi *multi_local;
  
  local_24 = CURLM_OK;
  if ((multi != (Curl_multi *)0x0) && (multi->socket_cb != (curl_socket_callback)0x0)) {
    for (pCStack_20 = Curl_llist_head(list);
        pCStack_20 != (Curl_llist_node *)0x0 && local_24 == CURLM_OK;
        pCStack_20 = Curl_node_next(pCStack_20)) {
      data = (Curl_easy *)Curl_node_elem(pCStack_20);
      local_24 = Curl_multi_ev_assess_xfer(multi,data);
    }
  }
  return local_24;
}

Assistant:

CURLMcode Curl_multi_ev_assess_xfer_list(struct Curl_multi *multi,
                                         struct Curl_llist *list)
{
  struct Curl_llist_node *e;
  CURLMcode result = CURLM_OK;

  if(multi && multi->socket_cb) {
    for(e = Curl_llist_head(list); e && !result; e = Curl_node_next(e)) {
      result = Curl_multi_ev_assess_xfer(multi, Curl_node_elem(e));
    }
  }
  return result;
}